

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
::Visit<google::protobuf::EnumDescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
           *this,EnumDescriptor *descriptor,EnumDescriptorProto *proto)

{
  iterator iVar1;
  EnumValueDescriptor *pEVar2;
  long lVar3;
  EnumDescriptorProto *pEVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  LifetimesInfo local_80;
  FileDescriptor *local_50;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>::iterator,_bool>
  local_48;
  
  if (descriptor->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
    local_80.full_name._M_str = (descriptor->all_names_).payload_;
    local_50 = descriptor->file_;
    local_80.full_name._M_len = (size_t)*(ushort *)(local_80.full_name._M_str + 2);
    puVar5 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
    local_80.filename._M_str = (char *)*puVar5;
    local_80.filename._M_len = puVar5[1];
    local_80.full_name._M_str = local_80.full_name._M_str + ~local_80.full_name._M_len;
    local_80.proto_features = descriptor->proto_features_;
    local_80.proto = &proto->super_Message;
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
    ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
              (&local_48,(void *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_50);
    iVar1._M_current = *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x10);
    if (iVar1._M_current == *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x18)) {
      std::
      vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
      ::_M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                  *)((long)local_48.first.field_1.slot_ + 8),iVar1,&local_80);
    }
    else {
      ((iVar1._M_current)->filename)._M_len = local_80.filename._M_len;
      ((iVar1._M_current)->filename)._M_str = local_80.filename._M_str;
      ((iVar1._M_current)->full_name)._M_len = local_80.full_name._M_len;
      ((iVar1._M_current)->full_name)._M_str = local_80.full_name._M_str;
      (iVar1._M_current)->proto_features = local_80.proto_features;
      (iVar1._M_current)->proto = local_80.proto;
      *(long *)((long)local_48.first.field_1.slot_ + 0x10) =
           *(long *)((long)local_48.first.field_1.slot_ + 0x10) + 0x30;
    }
  }
  if (0 < descriptor->value_count_) {
    lVar7 = 0x20;
    lVar6 = 0;
    do {
      pEVar2 = descriptor->values_;
      pEVar4 = (EnumDescriptorProto *)
               RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                         (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,(int)lVar6);
      if (*(FeatureSet **)(&pEVar2->super_SymbolBaseN<0> + lVar7) !=
          (FeatureSet *)_FeatureSet_default_instance_) {
        lVar3 = *(long *)((long)pEVar2 + lVar7 + -0x18);
        local_50 = *(FileDescriptor **)(*(long *)((long)pEVar2 + lVar7 + -0x10) + 0x10);
        local_80.full_name._M_str = *(char **)(lVar3 + 0x20);
        local_80.full_name._M_len = *(size_t *)(lVar3 + 0x28);
        puVar5 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
        local_80.filename._M_str = (char *)*puVar5;
        local_80.filename._M_len = puVar5[1];
        local_80.proto_features = *(FeatureSet **)(&pEVar2->super_SymbolBaseN<0> + lVar7);
        local_80.proto = (Message *)pEVar4;
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
        ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
                  (&local_48,(void *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_50);
        iVar1._M_current = *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x10);
        if (iVar1._M_current == *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x18)) {
          std::
          vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
          ::_M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                    ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                      *)((long)local_48.first.field_1.slot_ + 8),iVar1,&local_80);
        }
        else {
          ((iVar1._M_current)->filename)._M_len = local_80.filename._M_len;
          ((iVar1._M_current)->filename)._M_str = local_80.filename._M_str;
          ((iVar1._M_current)->full_name)._M_len = local_80.full_name._M_len;
          ((iVar1._M_current)->full_name)._M_str = local_80.full_name._M_str;
          (iVar1._M_current)->proto_features = local_80.proto_features;
          (iVar1._M_current)->proto = local_80.proto;
          *(long *)((long)local_48.first.field_1.slot_ + 0x10) =
               *(long *)((long)local_48.first.field_1.slot_ + 0x10) + 0x30;
        }
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x30;
    } while (lVar6 < descriptor->value_count_);
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }